

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

String * __thiscall
kj::_::Debug::makeDescription<char_const(&)[24],unsigned_long&,unsigned_short&>
          (String *__return_storage_ptr__,Debug *this,char *macroArgs,char (*params) [24],
          unsigned_long *params_1,unsigned_short *params_2)

{
  unsigned_long *params_00;
  unsigned_short *params_01;
  long lVar1;
  ArrayPtr<kj::String> argValues_00;
  String argValues [3];
  
  str<char_const(&)[24]>(argValues,(kj *)macroArgs,(char (*) [24])macroArgs);
  str<unsigned_long&>(argValues + 1,(kj *)params,params_00);
  str<unsigned_short&>(argValues + 2,(kj *)params_1,params_01);
  argValues_00.size_ = 3;
  argValues_00.ptr = argValues;
  makeDescriptionInternal(__return_storage_ptr__,(char *)this,argValues_00);
  lVar1 = 0x30;
  do {
    Array<char>::~Array((Array<char> *)((long)&argValues[0].content.ptr + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

String Debug::makeDescription(const char* macroArgs, Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  return makeDescriptionInternal(macroArgs, arrayPtr(argValues, sizeof...(Params)));
}